

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseGateStandard(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_GateType_t GateType)

{
  Ver_Stream_t *p;
  char cVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pName;
  Abc_Obj_t *pObj;
  Hop_Obj_t *pHVar4;
  Ver_GateType_t VVar5;
  Abc_Obj_t *pFanin;
  char *__format;
  
  p = pMan->pReader;
  iVar2 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if (iVar2 != 0) {
    Ver_StreamMove(p);
    cVar1 = Ver_StreamPopChar(p);
    if (cVar1 == '(') {
      Ver_ParseSkipComments(pMan);
      pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      pName = Ver_ParseGetName(pMan);
      while (pName != (char *)0x0) {
        pObj = Ver_ParseFindNet(pNtk,pName);
        if (pObj == (Abc_Obj_t *)0x0) {
          __format = "Net is missing in gate %s.";
LAB_00350ac1:
          sprintf(pMan->sError,__format,pName);
          goto LAB_00350ac8;
        }
        pFanin = pAVar3;
        if ((pAVar3->vFanouts).nSize != 0) {
          pFanin = pObj;
          pObj = pAVar3;
        }
        Abc_ObjAddFanin(pObj,pFanin);
        Ver_ParseSkipComments(pMan);
        cVar1 = Ver_StreamPopChar(p);
        if (cVar1 != ',') {
          if (cVar1 == ')') {
            VVar5 = GateType & ~VER_GATE_NAND;
            if ((VVar5 == VER_GATE_BUF) && ((pAVar3->vFanins).nSize != 1)) {
              pName = Abc_ObjName((Abc_Obj_t *)
                                  pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
              __format = "Buffer or interver with multiple fanouts %s (currently not supported).";
            }
            else {
              Ver_ParseSkipComments(pMan);
              cVar1 = Ver_StreamPopChar(p);
              if (cVar1 == ';') {
                if (VVar5 == VER_GATE_XOR) {
                  pHVar4 = Hop_CreateExor((Hop_Man_t *)pNtk->pManFunc,(pAVar3->vFanins).nSize);
                }
                else if (VVar5 == VER_GATE_OR) {
                  pHVar4 = Hop_CreateOr((Hop_Man_t *)pNtk->pManFunc,(pAVar3->vFanins).nSize);
                }
                else {
                  if (((GateType & ~VER_GATE_NAND) != VER_GATE_AND) && (VVar5 != VER_GATE_BUF))
                  goto LAB_00350b0a;
                  pHVar4 = Hop_CreateAnd((Hop_Man_t *)pNtk->pManFunc,(pAVar3->vFanins).nSize);
                }
                (pAVar3->field_5).pData = pHVar4;
LAB_00350b0a:
                if ((GateType & ~VER_GATE_BUF) != VER_GATE_NAND) {
                  return 1;
                }
                *(byte *)&pAVar3->field_5 = *(byte *)&pAVar3->field_5 ^ 1;
                return 1;
              }
              pName = Abc_ObjName((Abc_Obj_t *)
                                  pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]);
              __format = "Cannot read standard gate %s (expected closing semicolumn).";
            }
          }
          else {
            pName = Abc_ObjName((Abc_Obj_t *)pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanouts).pArray]
                               );
            __format = "Cannot parse a standard gate %s (expected closing parenthesis).";
          }
          goto LAB_00350ac1;
        }
        Ver_ParseSkipComments(pMan);
        pName = Ver_ParseGetName(pMan);
      }
    }
    else {
      builtin_strncpy(pMan->sError,"Cannot parse a standard gate (expected opening parenthesis).",
                      0x3d);
LAB_00350ac8:
      Ver_ParsePrintErrorMessage(pMan);
    }
  }
  return 0;
}

Assistant:

int Ver_ParseGateStandard( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_GateType_t GateType )
{
    extern void Ver_StreamMove( Ver_Stream_t * p );
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNet, * pNode;
    char * pWord, Symbol;

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;
    Ver_StreamMove( p );

    // this is gate name - throw it away
    if ( Ver_StreamPopChar(p) != '(' )
    {
        sprintf( pMan->sError, "Cannot parse a standard gate (expected opening parenthesis)." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    Ver_ParseSkipComments( pMan );

    // create the node
    pNode = Abc_NtkCreateNode( pNtk );

    // parse pairs of formal/actural inputs
    while ( 1 )
    {
        // parse the output name
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;
        // get the net corresponding to this output
        pNet = Ver_ParseFindNet( pNtk, pWord );
        if ( pNet == NULL )
        {
            sprintf( pMan->sError, "Net is missing in gate %s.", pWord );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        // if this is the first net, add it as an output
        if ( Abc_ObjFanoutNum(pNode) == 0 )
            Abc_ObjAddFanin( pNet, pNode );
        else
            Abc_ObjAddFanin( pNode, pNet );
        // check if it is the end of gate
        Ver_ParseSkipComments( pMan );
        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ')' )
            break;
        // skip comma
        if ( Symbol != ',' )
        {
            sprintf( pMan->sError, "Cannot parse a standard gate %s (expected closing parenthesis).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            Ver_ParsePrintErrorMessage( pMan );
            return 0;
        }
        Ver_ParseSkipComments( pMan );
    }
    if ( (GateType == VER_GATE_BUF || GateType == VER_GATE_NOT) && Abc_ObjFaninNum(pNode) != 1 )
    {
        sprintf( pMan->sError, "Buffer or interver with multiple fanouts %s (currently not supported).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }

    // check if it is the end of gate
    Ver_ParseSkipComments( pMan );
    if ( Ver_StreamPopChar(p) != ';' )
    {
        sprintf( pMan->sError, "Cannot read standard gate %s (expected closing semicolumn).", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    // add logic function
    if ( GateType == VER_GATE_AND || GateType == VER_GATE_NAND )
        pNode->pData = Hop_CreateAnd( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_OR || GateType == VER_GATE_NOR )
        pNode->pData = Hop_CreateOr( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_XOR || GateType == VER_GATE_XNOR )
        pNode->pData = Hop_CreateExor( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    else if ( GateType == VER_GATE_BUF || GateType == VER_GATE_NOT )
        pNode->pData = Hop_CreateAnd( (Hop_Man_t *)pNtk->pManFunc, Abc_ObjFaninNum(pNode) );
    if ( GateType == VER_GATE_NAND || GateType == VER_GATE_NOR || GateType == VER_GATE_XNOR || GateType == VER_GATE_NOT )
        pNode->pData = Hop_Not( (Hop_Obj_t *)pNode->pData );
    return 1;
}